

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QTzType>::reallocateAndGrow
          (QArrayDataPointer<QTzType> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QTzType> *old)

{
  QArrayData *pQVar1;
  QTzType *pQVar2;
  undefined1 *puVar3;
  Data *pDVar4;
  bool bVar5;
  long lVar6;
  qsizetype toCopy;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QTzType> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QTzType> *)0x0 && where == GrowsAtEnd) {
    pDVar4 = this->d;
    if (pDVar4 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar4 == (Data *)0x0) {
        lVar7 = 0;
        lVar6 = 0;
      }
      else {
        lVar7 = (pDVar4->super_QArrayData).alloc;
        lVar6 = (this->size - (pDVar4->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 3);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QtPrivate::QPodArrayOps<QTzType>::reallocate
                  ((QPodArrayOps<QTzType> *)this,lVar7 + n + lVar6,Grow);
        return;
      }
      goto LAB_0040f277;
    }
  }
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (QTzType *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_48,this,n,where);
  if ((n < 1) || (local_48.ptr != (QTzType *)0x0)) {
    if ((this->size != 0) && (lVar7 = this->size + (n >> 0x3f & n), lVar7 != 0)) {
      memcpy(local_48.ptr + local_48.size,this->ptr,lVar7 * 8);
      local_48.size = local_48.size + lVar7;
    }
    pQVar1 = &this->d->super_QArrayData;
    pQVar2 = this->ptr;
    this->d = local_48.d;
    this->ptr = local_48.ptr;
    puVar3 = (undefined1 *)this->size;
    this->size = local_48.size;
    local_48.d = (Data *)pQVar1;
    local_48.ptr = pQVar2;
    local_48.size = (qsizetype)puVar3;
    if (old != (QArrayDataPointer<QTzType> *)0x0) {
      local_48.d = old->d;
      local_48.ptr = old->ptr;
      old->d = (Data *)pQVar1;
      old->ptr = pQVar2;
      local_48.size = old->size;
      old->size = (qsizetype)puVar3;
    }
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,8,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    qBadAlloc();
  }
LAB_0040f277:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }